

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_C0003_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_C0003_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  value_view v_00;
  value_view v_01;
  bool bVar1;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_00;
  const_reference pvVar2;
  char *pcVar3;
  char *in_R9;
  key_view akey;
  key_view akey_00;
  key_view akey_01;
  string local_5a8;
  AssertHelper local_588;
  Message local_580;
  bool local_571;
  undefined1 local_570 [8];
  AssertionResult gtest_ar__6;
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffaa8;
  AssertHelper local_540;
  Message local_538 [2];
  value_view local_528;
  bool local_511;
  undefined1 local_510 [8];
  AssertionResult gtest_ar__5;
  Message local_4f8;
  int local_4ec;
  key_view local_4e8;
  uint64_t local_4d8;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_4a0;
  Message local_498;
  bool local_489;
  undefined1 local_488 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_458;
  Message local_450 [2];
  value_view local_440;
  bool local_429;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__3;
  Message local_410;
  int local_404;
  key_view local_400;
  uint64_t local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_3b8;
  Message local_3b0;
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_370;
  Message local_368 [2];
  value_view local_358;
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar__1;
  Message local_328;
  int local_31c;
  key_view local_318;
  uint64_t local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_;
  iterator b;
  TypeParam *db;
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  ARTIteratorTest_C0003_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  tree_verifier(in_stack_fffffffffffffaa8,
                gtest_ar__6.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._7_1_);
  this_00 = unodb::test::
            tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            ::get_db((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  insert<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *)&db,0xaa00,v,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  v_00._M_ptr = pvVar2->_M_ptr;
  v_00._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  insert<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *)&db,0xab0c,v_00,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  v_01._M_ptr = pvVar2->_M_ptr;
  v_01._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  insert<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *)&db,0xab0d,v_01,false);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::test_only_iterator
            ((iterator *)&gtest_ar_.message_,this_00);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::first
            ((iterator *)&gtest_ar_.message_);
  local_2b9 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2b8,(AssertionResult *)"b.valid()",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xdc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_318 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key((iterator *)&gtest_ar_.message_);
  akey._M_extent = local_318._M_extent._M_extent_value;
  akey._M_ptr = (pointer)akey._M_extent._M_extent_value;
  local_308 = decode((anon_unknown_dwarf_d5c8 *)local_318._M_ptr,akey);
  local_31c = 0xaa00;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_300,"(decode(b.get_key()))","(0xaa00)",&local_308,&local_31c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xde,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_358 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_val((iterator *)&gtest_ar_.message_);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_341 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_358,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_340,&local_341,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_340,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xe0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_370,local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            ((iterator *)&gtest_ar_.message_);
  local_3a1 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a0,&local_3a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_3a0,(AssertionResult *)"b.valid()",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xe3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  local_400 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key((iterator *)&gtest_ar_.message_);
  akey_00._M_extent = local_400._M_extent._M_extent_value;
  akey_00._M_ptr = (pointer)akey_00._M_extent._M_extent_value;
  local_3f0 = decode((anon_unknown_dwarf_d5c8 *)local_400._M_ptr,akey_00);
  local_404 = 0xab0c;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3e8,"(decode(b.get_key()))","(0xab0c)",&local_3f0,&local_404);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xe5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  local_440 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_val((iterator *)&gtest_ar_.message_);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_429 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_440,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_428,&local_429,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(local_450);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_428,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_458,local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            ((iterator *)&gtest_ar_.message_);
  local_489 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_488,&local_489,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_488,(AssertionResult *)"b.valid()",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  local_4e8 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key((iterator *)&gtest_ar_.message_);
  akey_01._M_extent = local_4e8._M_extent._M_extent_value;
  akey_01._M_ptr = (pointer)akey_01._M_extent._M_extent_value;
  local_4d8 = decode((anon_unknown_dwarf_d5c8 *)local_4e8._M_ptr,akey_01);
  local_4ec = 0xab0d;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4d0,"(decode(b.get_key()))","(0xab0d)",&local_4d8,&local_4ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  local_528 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_val((iterator *)&gtest_ar_.message_);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_511 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_528,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_510,&local_511,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_510,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[2])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__6.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xee,pcVar3);
    testing::internal::AssertHelper::operator=(&local_540,local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            ((iterator *)&gtest_ar_.message_);
  local_571 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)&gtest_ar_.message_);
  local_571 = !local_571;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_570,&local_571,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5a8,(internal *)local_570,(AssertionResult *)"b.valid()","true","false",in_R9)
    ;
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_5a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xf1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    std::__cxx11::string::~string((string *)&local_5a8);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)&gtest_ar_.message_);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ~tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)&db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, C0003) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0xaa00, unodb::test::test_values[0]);
  verifier.insert(0xab0c, unodb::test::test_values[1]);
  verifier.insert(0xab0d, unodb::test::test_values[2]);
  auto b = db.test_only_iterator();
  b.first();  // obtain iterators.
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0xaa00);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[0]));
  }
  b.next();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0xab0c);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[1]));
  }
  b.next();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0xab0d);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[2]));
  }
  b.next();
  UNODB_EXPECT_FALSE(b.valid());  // nothing more in the iterator.
}